

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats(ConsumerEndpointImpl *this)

{
  TraceStats *this_00;
  TracingServiceImpl *this_01;
  pointer this_02;
  TaskRunner *pTVar1;
  undefined8 uVar2;
  TracingSession *tracing_session;
  undefined8 *puVar3;
  TraceStats stats;
  undefined8 *local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  code *pcStack_1a0;
  undefined1 local_198 [200];
  TraceStats local_d0;
  
  protos::gen::TraceStats::TraceStats(&local_d0);
  this_01 = this->service_;
  tracing_session = GetTracingSession(this_01,this->tracing_session_id_);
  if (tracing_session != (TracingSession *)0x0) {
    TracingServiceImpl::GetTraceStats((TraceStats *)local_198,this_01,tracing_session);
    protos::gen::TraceStats::operator=(&local_d0,(TraceStats *)local_198);
    protos::gen::TraceStats::~TraceStats((TraceStats *)local_198);
  }
  local_198._0_8_ =
       (this->weak_ptr_factory_).weak_ptr_.handle_.
       super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  this_02 = (pointer)(this->weak_ptr_factory_).weak_ptr_.handle_.
                     super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
  if (this_02 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&this_02->buffer_size_ = (int)this_02->buffer_size_ + 1;
      UNLOCK();
    }
    else {
      *(int *)&this_02->buffer_size_ = (int)this_02->buffer_size_ + 1;
    }
  }
  pTVar1 = this->task_runner_;
  if (this_02 != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&this_02->buffer_size_ = (int)this_02->buffer_size_ + 1;
      UNLOCK();
    }
    else {
      *(int *)&this_02->buffer_size_ = (int)this_02->buffer_size_ + 1;
    }
  }
  local_198[0x10] = tracing_session != (TracingSession *)0x0;
  this_00 = (TraceStats *)(local_198 + 0x18);
  local_198._8_8_ = this_02;
  protos::gen::TraceStats::TraceStats(this_00,&local_d0);
  local_1a8 = (code *)0x0;
  pcStack_1a0 = (code *)0x0;
  local_1b8 = (undefined8 *)0x0;
  uStack_1b0 = 0;
  puVar3 = (undefined8 *)operator_new(200);
  uVar2 = local_198._8_8_;
  *puVar3 = local_198._0_8_;
  puVar3[1] = 0;
  local_198._8_8_ = (pointer)0x0;
  puVar3[1] = uVar2;
  local_198._0_8_ = (_func_int **)0x0;
  *(undefined1 *)(puVar3 + 2) = local_198[0x10];
  protos::gen::TraceStats::TraceStats((TraceStats *)(puVar3 + 3),this_00);
  pcStack_1a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59649:26)>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59649:26)>
              ::_M_manager;
  local_1b8 = puVar3;
  (*pTVar1->_vptr_TaskRunner[2])(pTVar1);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,3);
  }
  protos::gen::TraceStats::~TraceStats(this_00);
  if ((pointer)local_198._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
  }
  if (this_02 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  }
  protos::gen::TraceStats::~TraceStats(&local_d0);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  bool success = false;
  TraceStats stats;
  TracingSession* session = service_->GetTracingSession(tracing_session_id_);
  if (session) {
    success = true;
    stats = service_->GetTraceStats(session);
  }
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, success, stats] {
    if (weak_this)
      weak_this->consumer_->OnTraceStats(success, stats);
  });
}